

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall
CLIntercept::dumpProgramBuildLog
          (CLIntercept *this,cl_program program,cl_device_id device,char *buildLog,
          size_t buildLogSize)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  size_t size;
  mapped_type *pmVar6;
  long lVar7;
  long *plVar8;
  size_type *psVar9;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar11;
  cl_device_type deviceType;
  string fileName;
  char numberString [256];
  ulong local_1a0;
  string local_198;
  char *local_178;
  size_t local_170;
  cl_device_id local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  cl_program local_140;
  string local_138 [8];
  
  local_140 = program;
  pmVar6 = std::
           map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
           ::operator[](&this->m_ProgramInfoMap,&local_140);
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  local_198._M_string_length = 0;
  local_198.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)local_138,sc_DumpDirectoryName,(allocator *)&local_160);
  local_178 = buildLog;
  local_170 = buildLogSize;
  local_168 = device;
  OS::Services_Common::GetDumpDirectoryName
            (&(this->m_OS).super_Services_Common,local_138,&local_198);
  paVar1 = &local_138[0].field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_138[0]._M_dataplus._M_p);
  }
  memset(local_138,0,0x100);
  if ((this->m_Config).OmitProgramNumber == true) {
    uVar2 = pmVar6->CompileCount;
    uVar3 = (uint)pmVar6->ProgramHash;
    uVar4 = (uint)pmVar6->OptionsHash;
    pcVar5 = "$%08X_%04u_%08X";
  }
  else {
    uVar2 = (uint)pmVar6->ProgramHash;
    uVar3 = pmVar6->ProgramNumber;
    uVar4 = pmVar6->CompileCount;
    pcVar5 = "$%04u_%08X_%04u_%08X";
  }
  snprintf((char *)local_138,0x100,pcVar5 + 1,(ulong)uVar3,(ulong)uVar2,(ulong)uVar4);
  std::__cxx11::string::append((char *)&local_198);
  std::__cxx11::string::append((char *)&local_198);
  lVar7 = std::__cxx11::string::find((char *)&local_198,0x19d01b,0);
  lVar7 = std::__cxx11::string::find((char *)&local_198,0x19d01b,lVar7 + 1);
  if (lVar7 != -1) {
    do {
      std::__cxx11::string::substr((ulong)local_138,(ulong)&local_198);
      mkdir(local_138[0]._M_dataplus._M_p,0x1ff);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_138[0]._M_dataplus._M_p);
      }
      lVar7 = std::__cxx11::string::find((char *)&local_198,0x19d01b,lVar7 + 1);
    } while (lVar7 != -1);
  }
  local_1a0 = 1;
  (*(this->m_Dispatch).clGetDeviceInfo)(local_168,0x1000,8,&local_1a0,(size_t *)0x0);
  if ((local_1a0 & 2) != 0) {
    std::__cxx11::string::append((char *)&local_198);
  }
  if ((local_1a0 & 4) != 0) {
    std::__cxx11::string::append((char *)&local_198);
  }
  if ((local_1a0 & 8) != 0) {
    std::__cxx11::string::append((char *)&local_198);
  }
  if ((local_1a0 & 0x10) != 0) {
    std::__cxx11::string::append((char *)&local_198);
  }
  std::__cxx11::string::append((char *)&local_198);
  std::operator+(&local_160,"Dumping build log to file: ",&local_198);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_160);
  psVar9 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    uVar10 = (undefined4)*psVar9;
    uVar11 = *(undefined4 *)((long)plVar8 + 0x14);
    local_138[0].field_2._0_8_ = *psVar9;
    local_138[0].field_2._8_4_ = (undefined4)plVar8[3];
    local_138[0].field_2._12_4_ = *(undefined4 *)((long)plVar8 + 0x1c);
    local_138[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138[0].field_2._0_8_ = *psVar9;
    uVar10 = extraout_XMM0_Da;
    uVar11 = extraout_XMM0_Db;
    local_138[0]._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_138[0]._M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  log(this,(double)CONCAT44(uVar11,uVar10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_138[0]._M_dataplus._M_p);
  }
  size = local_170;
  pcVar5 = local_178;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  dumpMemoryToFile(this,&local_198,false,pcVar5,size);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CLIntercept::dumpProgramBuildLog(
    const cl_program program,
    const cl_device_id device,
    const char* buildLog,
    const size_t buildLogSize )
{
    // We're already in a critical section when we get here, so we don't need to
    // grab the critical section again.

    CLI_ASSERT( config().DumpProgramBuildLogs );
    CLI_ASSERT( buildLog );

    const SProgramInfo& programInfo = m_ProgramInfoMap[ program ];

    std::string fileName;

    // Get the dump directory name.
    {
        OS().GetDumpDirectoryName( sc_DumpDirectoryName, fileName );
    }
    // Make the file name.  It will have the form:
    //   CLI_<program number>_<program hash>_<compile count>_<options hash>
    // Leave off the extension for now.
    {
        char    numberString[256] = "";

        if( config().OmitProgramNumber )
        {
            CLI_SPRINTF( numberString, 256, "%08X_%04u_%08X",
                (unsigned int)programInfo.ProgramHash,
                programInfo.CompileCount,
                (unsigned int)programInfo.OptionsHash );
        }
        else
        {
            CLI_SPRINTF( numberString, 256, "%04u_%08X_%04u_%08X",
                programInfo.ProgramNumber,
                (unsigned int)programInfo.ProgramHash,
                programInfo.CompileCount,
                (unsigned int)programInfo.OptionsHash );
        }

        fileName += "/CLI_";
        fileName += numberString;
    }
    // Now make directories as appropriate.
    {
        OS().MakeDumpDirectories( fileName );
    }

    cl_device_type  deviceType = CL_DEVICE_TYPE_DEFAULT;

    // It's OK if this fails.  If it does, it just
    // means that our output file won't have a device
    // type.
    dispatch().clGetDeviceInfo(
        device,
        CL_DEVICE_TYPE,
        sizeof( deviceType ),
        &deviceType,
        NULL );

    if( deviceType & CL_DEVICE_TYPE_CPU )
    {
        fileName += "_CPU";
    }
    if( deviceType & CL_DEVICE_TYPE_GPU )
    {
        fileName += "_GPU";
    }
    if( deviceType & CL_DEVICE_TYPE_ACCELERATOR )
    {
        fileName += "_ACC";
    }
    if( deviceType & CL_DEVICE_TYPE_CUSTOM )
    {
        fileName += "_CUSTOM";
    }

    fileName += "_build_log.txt";

    log( "Dumping build log to file: " + fileName + "\n" );
    dumpMemoryToFile(
        fileName,
        false,
        buildLog,
        buildLogSize );
}